

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBigInt.cpp
# Opt level: O2

void __thiscall
Js::JavascriptBigInt::MulThenAdd(JavascriptBigInt *this,digit_t digitMul,digit_t digitAdd)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  digit_t dVar5;
  digit_t *pdVar6;
  ulong uVar7;
  digit_t *pdVar8;
  digit_t local_38;
  digit_t carryDigit;
  
  if (digitMul == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBigInt.cpp"
                                ,0x166,"(digitMul != 0)","digitMul != 0");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  local_38 = 0;
  pdVar6 = (this->m_digits).ptr;
  TVar1 = this->m_length;
  for (pdVar8 = pdVar6; pdVar8 < pdVar6 + TVar1; pdVar8 = pdVar8 + 1) {
    dVar5 = MulDigit(*pdVar8,digitMul,&local_38);
    *pdVar8 = dVar5;
    if (digitAdd != 0) {
      if (CARRY8(dVar5,digitAdd)) {
        local_38 = local_38 + 1;
      }
      *pdVar8 = dVar5 + digitAdd;
    }
    digitAdd = local_38;
  }
  if (digitAdd != 0) {
    uVar7 = this->m_length;
    if (this->m_maxLength <= uVar7) {
      Resize(this,uVar7 + 1);
      pdVar6 = (this->m_digits).ptr;
      uVar7 = this->m_length;
    }
    this->m_length = uVar7 + 1;
    pdVar6[uVar7] = digitAdd;
  }
  return;
}

Assistant:

void JavascriptBigInt::MulThenAdd(digit_t digitMul, digit_t digitAdd)
    {
        Assert(digitMul != 0);

        digit_t carryDigit = 0;
        digit_t *pDigit = m_digits;
        digit_t *pDigitLimit = pDigit + m_length;

        for (; pDigit < pDigitLimit; pDigit++)
        {
            *pDigit = JavascriptBigInt::MulDigit(*pDigit, digitMul, &carryDigit);// return low Digit to digit, hight Digit to carry
            if (digitAdd > 0)
            {
                *pDigit = JavascriptBigInt::AddDigit(*pDigit, digitAdd, &carryDigit);// add carry to result
            }
            digitAdd = carryDigit;
        }
        if (0 < digitAdd) // length increase by 1
        {
            if (m_length >= m_maxLength)
            {
                Resize(m_length + 1);
            }
            m_digits[m_length++] = digitAdd;
        }
    }